

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void terminal_end(EditLine *el)

{
  free((el->el_terminal).t_buf);
  (el->el_terminal).t_buf = (char *)0x0;
  free((el->el_terminal).t_cap);
  (el->el_terminal).t_cap = (char *)0x0;
  (el->el_terminal).t_loc = 0;
  free((el->el_terminal).t_str);
  (el->el_terminal).t_str = (char **)0x0;
  free((el->el_terminal).t_val);
  (el->el_terminal).t_val = (wchar_t *)0x0;
  free((el->el_terminal).t_fkey);
  (el->el_terminal).t_fkey = (funckey_t *)0x0;
  terminal_free_buffer(&el->el_display);
  terminal_free_buffer(&el->el_vdisplay);
  return;
}

Assistant:

libedit_private void
terminal_end(EditLine *el)
{

	el_free(el->el_terminal.t_buf);
	el->el_terminal.t_buf = NULL;
	el_free(el->el_terminal.t_cap);
	el->el_terminal.t_cap = NULL;
	el->el_terminal.t_loc = 0;
	el_free(el->el_terminal.t_str);
	el->el_terminal.t_str = NULL;
	el_free(el->el_terminal.t_val);
	el->el_terminal.t_val = NULL;
	el_free(el->el_terminal.t_fkey);
	el->el_terminal.t_fkey = NULL;
	terminal_free_display(el);
}